

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value-eval-util.hh
# Opt level: O1

vector<tinyusdz::value::normal3d,_std::allocator<tinyusdz::value::normal3d>_> *
tinyusdz::lerp<tinyusdz::value::normal3d>
          (vector<tinyusdz::value::normal3d,_std::allocator<tinyusdz::value::normal3d>_>
           *__return_storage_ptr__,
          vector<tinyusdz::value::normal3d,_std::allocator<tinyusdz::value::normal3d>_> *a,
          vector<tinyusdz::value::normal3d,_std::allocator<tinyusdz::value::normal3d>_> *b,double t)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  pointer pnVar5;
  pointer pnVar6;
  pointer pnVar7;
  ulong uVar8;
  long lVar9;
  ulong __new_size;
  double dVar10;
  
  (__return_storage_ptr__->
  super__Vector_base<tinyusdz::value::normal3d,_std::allocator<tinyusdz::value::normal3d>_>)._M_impl
  .super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<tinyusdz::value::normal3d,_std::allocator<tinyusdz::value::normal3d>_>)._M_impl
  .super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<tinyusdz::value::normal3d,_std::allocator<tinyusdz::value::normal3d>_>)._M_impl
  .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  uVar8 = ((long)(a->
                 super__Vector_base<tinyusdz::value::normal3d,_std::allocator<tinyusdz::value::normal3d>_>
                 )._M_impl.super__Vector_impl_data._M_finish -
           (long)(a->
                 super__Vector_base<tinyusdz::value::normal3d,_std::allocator<tinyusdz::value::normal3d>_>
                 )._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555;
  __new_size = ((long)(b->
                      super__Vector_base<tinyusdz::value::normal3d,_std::allocator<tinyusdz::value::normal3d>_>
                      )._M_impl.super__Vector_impl_data._M_finish -
                (long)(b->
                      super__Vector_base<tinyusdz::value::normal3d,_std::allocator<tinyusdz::value::normal3d>_>
                      )._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555;
  if (uVar8 <= __new_size) {
    __new_size = uVar8;
  }
  if (__new_size != 0) {
    std::vector<tinyusdz::value::normal3d,_std::allocator<tinyusdz::value::normal3d>_>::resize
              (__return_storage_ptr__,__new_size);
    pnVar5 = (a->
             super__Vector_base<tinyusdz::value::normal3d,_std::allocator<tinyusdz::value::normal3d>_>
             )._M_impl.super__Vector_impl_data._M_start;
    pnVar6 = (b->
             super__Vector_base<tinyusdz::value::normal3d,_std::allocator<tinyusdz::value::normal3d>_>
             )._M_impl.super__Vector_impl_data._M_start;
    if ((long)(a->
              super__Vector_base<tinyusdz::value::normal3d,_std::allocator<tinyusdz::value::normal3d>_>
              )._M_impl.super__Vector_impl_data._M_finish - (long)pnVar5 ==
        (long)(b->
              super__Vector_base<tinyusdz::value::normal3d,_std::allocator<tinyusdz::value::normal3d>_>
              )._M_impl.super__Vector_impl_data._M_finish - (long)pnVar6) {
      dVar10 = 1.0 - t;
      pnVar7 = (__return_storage_ptr__->
               super__Vector_base<tinyusdz::value::normal3d,_std::allocator<tinyusdz::value::normal3d>_>
               )._M_impl.super__Vector_impl_data._M_start;
      lVar9 = 0x10;
      do {
        dVar1 = *(double *)((long)pnVar5 + lVar9 + -8);
        dVar2 = *(double *)((long)&pnVar5->x + lVar9);
        dVar3 = *(double *)((long)pnVar6 + lVar9 + -8);
        dVar4 = *(double *)((long)&pnVar6->x + lVar9);
        *(double *)((long)pnVar7 + lVar9 + -0x10) =
             *(double *)((long)pnVar6 + lVar9 + -0x10) * t +
             *(double *)((long)pnVar5 + lVar9 + -0x10) * dVar10;
        *(double *)((long)pnVar7 + lVar9 + -8) = dVar3 * t + dVar1 * dVar10;
        *(double *)((long)&pnVar7->x + lVar9) = dVar4 * t + dVar2 * dVar10;
        lVar9 = lVar9 + 0x18;
        __new_size = __new_size - 1;
      } while (__new_size != 0);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

inline std::vector<T> lerp(const std::vector<T> &a, const std::vector<T> &b,
                           const double t) {
  std::vector<T> dst;

  // Choose shorter one
  size_t n = std::min(a.size(), b.size());
  if (n == 0) {
    return dst;
  }

  dst.resize(n);

  if (a.size() != b.size()) {
    return dst;
  }
  for (size_t i = 0; i < n; i++) {
    dst[i] = lerp(a[i], b[i], t);
  }

  return dst;
}